

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

int cpu_memory_rw_debug_mipsel
              (CPUState *cpu,target_ulong_conflict addr,void *ptr,target_ulong_conflict len,
              _Bool is_write)

{
  _func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *p_Var1;
  AddressSpace *as;
  vaddr vVar2;
  undefined4 in_EAX;
  uint uVar3;
  hwaddr hVar4;
  undefined7 in_register_00000081;
  uint uVar5;
  ulong len_00;
  MemTxAttrs attrs;
  undefined4 local_34;
  
  _attrs = CONCAT44((int)CONCAT71(in_register_00000081,is_write),in_EAX);
  while( true ) {
    if (len == 0) {
      return 0;
    }
    p_Var1 = cpu->cc->get_phys_page_attrs_debug;
    vVar2 = (vaddr)(addr & 0xfffff000);
    if (p_Var1 == (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x0) {
      _attrs = CONCAT44(local_34,1);
      hVar4 = (*cpu->cc->get_phys_page_debug)((CPUState_conflict *)cpu,vVar2);
    }
    else {
      hVar4 = (*p_Var1)((CPUState_conflict *)cpu,vVar2,&attrs);
    }
    uVar3 = cpu_asidx_from_attrs(cpu,attrs);
    if (hVar4 == 0xffffffffffffffff) break;
    uVar5 = ((addr & 0xfffff000) - addr) + 0x1000;
    if (len <= uVar5) {
      uVar5 = len;
    }
    len_00 = (ulong)uVar5;
    hVar4 = hVar4 + (addr & 0xfff);
    as = cpu->cpu_ases[uVar3].as;
    if ((char)local_34 == '\0') {
      address_space_read_full_mipsel(as,hVar4,attrs,ptr,len_00);
    }
    else {
      address_space_write_rom_mipsel(as,hVar4,attrs,ptr,len_00);
    }
    len = len - uVar5;
    ptr = (void *)((long)ptr + len_00);
    addr = addr + uVar5;
  }
  return -1;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}